

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O0

float tinyobj::parseFloat(char **token)

{
  long lVar1;
  size_t sVar2;
  double dStack_20;
  float f;
  double val;
  char *end;
  char **token_local;
  
  end = (char *)token;
  sVar2 = strspn(*token," \t");
  *(size_t *)end = sVar2 + *(long *)end;
  lVar1 = *(long *)end;
  sVar2 = strcspn(*(char **)end," \t\r");
  val = (double)(lVar1 + sVar2);
  dStack_20 = 0.0;
  tryParseDouble(*(char **)end,(char *)val,&stack0xffffffffffffffe0);
  *(double *)end = val;
  return (float)dStack_20;
}

Assistant:

static inline float parseFloat(const char *&token) {
  token += strspn(token, " \t");
#ifdef TINY_OBJ_LOADER_OLD_FLOAT_PARSER
  float f = (float)atof(token);
  token += strcspn(token, " \t\r");
#else
  const char *end = token + strcspn(token, " \t\r");
  double val = 0.0;
  tryParseDouble(token, end, &val);
  float f = static_cast<float>(val);
  token = end;
#endif
  return f;
}